

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ldst_multiple(DisasContext_conflict6 *ctx,uint32_t opc,int reglist,int base,int16_t offset)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 addr;
  TCGv_i64 pTVar1;
  TCGv_i32 pTVar2;
  code *func;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGv_i32 local_40;
  
  if ((ctx->hflags & 0x87f800) != 0) {
    generate_exception_end(ctx,0x14);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  addr = tcg_temp_new_i64(tcg_ctx);
  gen_base_offset_addr(ctx,addr,base,(int)offset);
  pTVar1 = tcg_const_i64_mips64el(tcg_ctx,(long)reglist);
  pTVar2 = tcg_const_i32_mips64el(tcg_ctx,ctx->mem_idx);
  save_cpu_state(ctx,1);
  switch(opc - 5 >> 1 | (uint)((opc - 5 & 1) != 0) << 0x1f) {
  case 0:
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    func = helper_lwm_mips64el;
    break;
  case 1:
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    func = helper_ldm_mips64el;
    break;
  default:
    goto switchD_0089655f_caseD_2;
  case 4:
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    func = helper_swm_mips64el;
    break;
  case 5:
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    func = helper_sdm_mips64el;
  }
  local_40 = pTVar2 + (long)&tcg_ctx->pool_cur;
  local_48 = pTVar1 + (long)&tcg_ctx->pool_cur;
  local_50 = addr + (long)&tcg_ctx->pool_cur;
  tcg_gen_callN_mips64el(tcg_ctx,func,(TCGTemp *)0x0,4,&local_58);
switchD_0089655f_caseD_2:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_ldst_multiple(DisasContext *ctx, uint32_t opc, int reglist,
                              int base, int16_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;
    TCGv_i32 t2;

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);

    gen_base_offset_addr(ctx, t0, base, offset);

    t1 = tcg_const_tl(tcg_ctx, reglist);
    t2 = tcg_const_i32(tcg_ctx, ctx->mem_idx);

    save_cpu_state(ctx, 1);
    switch (opc) {
    case LWM32:
        gen_helper_lwm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
    case SWM32:
        gen_helper_swm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
#ifdef TARGET_MIPS64
    case LDM:
        gen_helper_ldm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
    case SDM:
        gen_helper_sdm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
}